

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

int __thiscall bsim::quad_value_bit_vector::to_type<int>(quad_value_bit_vector *this)

{
  byte bVar1;
  int iVar2;
  int i;
  long lVar3;
  int iVar4;
  quad_value local_29;
  
  iVar4 = 1;
  iVar2 = 0;
  for (lVar3 = 0; lVar3 < this->N; lVar3 = lVar3 + 1) {
    local_29.value =
         (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
         _M_impl.super__Vector_impl_data._M_start[lVar3].value;
    bVar1 = quad_value::binary_value(&local_29);
    iVar2 = iVar2 + (uint)bVar1 * iVar4;
    iVar4 = iVar4 * 2;
  }
  return iVar2;
}

Assistant:

ConvType to_type() const {
      ConvType tmp = 0;
      ConvType exp = 1;
      for (int i = 0; i < bitLength(); i++) {
        tmp += exp*get(i).binary_value();
        exp *= 2;
      }
      return tmp;
      // ConvType tmp = *(const_cast<ConvType*>((const ConvType*) (&(bits[0]))));
      // //TODO FIXME I am a sketchy hack.
      // ConvType mask = sizeof(ConvType) > bits.size() ? (1<<N)-1 : -1; 
      // return tmp & mask;
    }